

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlParserInputPtr xmlSAX2ResolveEntity(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  xmlChar *pxVar1;
  xmlParserInputPtr pxVar2;
  
  if (ctx == (void *)0x0) {
    pxVar2 = (xmlParserInputPtr)0x0;
  }
  else {
    if ((*(long *)((long)ctx + 0x38) == 0) ||
       (pxVar1 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), pxVar1 == (xmlChar *)0x0)) {
      pxVar1 = *(xmlChar **)((long)ctx + 0x118);
    }
    pxVar1 = xmlBuildURI(systemId,pxVar1);
    pxVar2 = xmlLoadExternalEntity((char *)pxVar1,(char *)publicId,(xmlParserCtxtPtr)ctx);
    if (pxVar1 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar1);
    }
  }
  return pxVar2;
}

Assistant:

xmlParserInputPtr
xmlSAX2ResolveEntity(void *ctx, const xmlChar *publicId, const xmlChar *systemId)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr ret;
    xmlChar *URI;
    const char *base = NULL;

    if (ctx == NULL) return(NULL);
    if (ctxt->input != NULL)
	base = ctxt->input->filename;
    if (base == NULL)
	base = ctxt->directory;

    URI = xmlBuildURI(systemId, (const xmlChar *) base);

#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2ResolveEntity(%s, %s)\n", publicId, systemId);
#endif

    ret = xmlLoadExternalEntity((const char *) URI,
				(const char *) publicId, ctxt);
    if (URI != NULL)
	xmlFree(URI);
    return(ret);
}